

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void colide_all(PObject actor,Point *target)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  while( true ) {
    uVar3 = (ulong)uVar2;
    if ((ulong)((long)Object::obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)Object::obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= uVar3) break;
    bVar1 = operator==(&Object::obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar3]->position,target);
    if (bVar1) {
      (*actor->_vptr_Object[1])
                (actor,Object::obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar3]);
    }
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void colide_all(PObject actor, const Point& target){
	for (unsigned int i = 0; i < Object::obj.size(); i++){
		if (Object::obj[i]->position == target){
			actor->colide(Object::obj[i]);
		}
	}
}